

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

iterator * __thiscall QTextBlock::end(iterator *__return_storage_ptr__,QTextBlock *this)

{
  uint uVar1;
  quint32 qVar2;
  QTextDocumentPrivate *pQVar3;
  int k;
  uint uVar4;
  uint uVar5;
  
  pQVar3 = this->p;
  uVar1 = this->n;
  if (uVar1 == 0 || pQVar3 == (QTextDocumentPrivate *)0x0) {
    __return_storage_ptr__->p = (QTextDocumentPrivate *)0x0;
    __return_storage_ptr__->b = 0;
    __return_storage_ptr__->e = 0;
    *(undefined8 *)&__return_storage_ptr__->n = 0;
  }
  else {
    k = position(this);
    qVar2 = (pQVar3->blocks).data.field_0.fragments[uVar1].super_QFragment<3>.size_array[0];
    uVar4 = QFragmentMapData<QTextFragmentData>::findNode(&(pQVar3->fragments).data,k,0);
    uVar5 = QFragmentMapData<QTextFragmentData>::findNode
                      (&(this->p->fragments).data,k + qVar2 + -1,0);
    __return_storage_ptr__->p = this->p;
    __return_storage_ptr__->b = uVar4;
    __return_storage_ptr__->e = uVar5;
    __return_storage_ptr__->n = uVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

QTextBlock::iterator QTextBlock::end() const
{
    if (!p || !n)
        return iterator();

    int pos = position();
    int len = length() - 1; // exclude the fragment that holds the paragraph separator
    int b = p->fragmentMap().findNode(pos);
    int e = p->fragmentMap().findNode(pos+len);
    return iterator(p, b, e, e);
}